

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O1

char * dup_entry_string_or_bail(MMDB_entry_data_s entry_data)

{
  ulong uVar1;
  char *__dest;
  ulong uVar2;
  ulong __n;
  void *in_stack_00000018;
  
  uVar1 = (ulong)entry_data.field_1.pointer;
  uVar2 = 0;
  __n = uVar2;
  if (uVar1 != 0) {
    do {
      __n = uVar2;
      if (*(char *)((long)in_stack_00000018 + uVar2) == '\0') break;
      uVar2 = uVar2 + 1;
      __n = uVar1;
    } while (uVar1 != uVar2);
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,in_stack_00000018,__n);
    __dest[__n] = '\0';
  }
  if (__dest == (char *)0x0) {
    bail_out(0,"mmdb_strndup failed",0);
  }
  return __dest;
}

Assistant:

char *dup_entry_string_or_bail(MMDB_entry_data_s entry_data) {
    char *string = mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
    if (NULL == string) {
        BAIL_OUT("mmdb_strndup failed");
    }

    return string;
}